

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::SignTransaction(CWallet *this,CMutableTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  long lVar3;
  bool bVar4;
  uint nHeightIn;
  const_iterator cVar5;
  mapped_type *this_00;
  ulong uVar6;
  pointer __k;
  long in_FS_OFFSET;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &coins._M_t._M_impl.super__Rb_tree_header._M_header;
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __k = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start;
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (__k == pCVar2) {
      input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &input_errors._M_t._M_impl.super__Rb_tree_header._M_header;
      input_errors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar4 = SignTransaction(this,tx,&coins,0,&input_errors);
      nHeightIn = (uint)bVar4;
      std::
      _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::~_Rb_tree(&input_errors._M_t);
LAB_00998c63:
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&coins._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return SUB41(nHeightIn,0);
      }
      __stack_chk_fail();
    }
    cVar5 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->mapWallet)._M_h,(key_type *)__k);
    if (cVar5.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
        (__node_type *)0x0) {
      nHeightIn = 0;
      goto LAB_00998c63;
    }
    uVar6 = (ulong)(__k->prevout).n;
    lVar3 = *(long *)(*(long *)((long)cVar5.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18);
    nHeightIn = 0;
    if ((ulong)((*(long *)(*(long *)((long)cVar5.
                                           super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                           ._M_cur + 0x1c0) + 0x20) - lVar3) / 0x28) <= uVar6)
    goto LAB_00998c63;
    if (*(char *)((long)cVar5.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1f8) == '\0') {
      nHeightIn = *(uint *)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1f0);
    }
    bVar4 = CWalletTx::IsCoinBase
                      ((CWalletTx *)
                       ((long)cVar5.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x28));
    Coin::Coin((Coin *)&input_errors,(CTxOut *)(lVar3 + uVar6 * 0x28),nHeightIn,bVar4);
    this_00 = std::
              map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::operator[](&coins,&__k->prevout);
    Coin::operator=(this_00,(Coin *)&input_errors);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               &input_errors._M_t._M_impl.super__Rb_tree_header);
    __k = __k + 1;
  } while( true );
}

Assistant:

bool CWallet::SignTransaction(CMutableTransaction& tx) const
{
    AssertLockHeld(cs_wallet);

    // Build coins map
    std::map<COutPoint, Coin> coins;
    for (auto& input : tx.vin) {
        const auto mi = mapWallet.find(input.prevout.hash);
        if(mi == mapWallet.end() || input.prevout.n >= mi->second.tx->vout.size()) {
            return false;
        }
        const CWalletTx& wtx = mi->second;
        int prev_height = wtx.state<TxStateConfirmed>() ? wtx.state<TxStateConfirmed>()->confirmed_block_height : 0;
        coins[input.prevout] = Coin(wtx.tx->vout[input.prevout.n], prev_height, wtx.IsCoinBase());
    }
    std::map<int, bilingual_str> input_errors;
    return SignTransaction(tx, coins, SIGHASH_DEFAULT, input_errors);
}